

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall
Clone_componentWithVariables_Test::Clone_componentWithVariables_Test
          (Clone_componentWithVariables_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_001171c0;
  return;
}

Assistant:

TEST(Clone, componentWithVariables)
{
    auto c = libcellml::Component::create();
    auto u = libcellml::Units::create();
    auto v1 = libcellml::Variable::create();
    auto v2 = libcellml::Variable::create();

    u->setName("daves");
    v1->setUnits(u);

    c->setId("unique");
    c->setName("copy");

    c->addVariable(v1);
    c->addVariable(v2);

    auto cClone = c->clone();

    compareComponent(c, cClone);
}